

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p_actionfunctions.cpp
# Opt level: O1

int AF_AStateProvider_A_CustomPunch
              (VMValue *param,TArray<VMValue,_VMValue> *defaultparam,int numparam,VMReturn *ret,
              int numret)

{
  byte *pbVar1;
  int iVar2;
  int iVar3;
  AActor *t1;
  undefined8 *puVar4;
  void *pvVar5;
  AWeapon *this;
  int iVar6;
  uint uVar7;
  uint uVar8;
  int max;
  undefined4 extraout_var;
  undefined8 uVar9;
  PClass *pPVar10;
  VMValue *pVVar11;
  PClass *pPVar12;
  PClassActor *pufftype;
  PClassInventory *type;
  AInventory *this_00;
  VMValue *pVVar13;
  VMValue *pVVar14;
  PClassInventory *pPVar15;
  FSoundID *sound_id;
  TArray<VMValue,_VMValue> *pTVar16;
  char *pcVar17;
  bool bVar18;
  undefined4 uVar19;
  undefined4 uVar20;
  int actualdamage;
  FTranslatedLineTarget t;
  int local_e4;
  _func_int **local_e0;
  uint local_d4;
  void *local_d0;
  double local_c8;
  undefined8 uStack_c0;
  PClassInventory *local_b0;
  AActor *local_a8;
  PClassActor *local_a0;
  FSoundID local_98;
  FSoundID local_94;
  FSoundID local_90;
  FName local_8c;
  FTranslatedLineTarget local_88;
  undefined1 local_68 [32];
  DAngle local_48;
  DThinker *local_40;
  AActor *local_38;
  
  pPVar12 = AActor::RegistrationInfo.MyClass;
  if (0 < numparam) {
    if (((param->field_0).field_3.Type != '\x03') ||
       (((param->field_0).field_1.atag != 1 && ((param->field_0).field_1.a != (void *)0x0)))) {
LAB_003cd425:
      pcVar17 = 
      "param[paramnum].Type == REGT_POINTER && (param[paramnum].atag == ATAG_OBJECT || param[paramnum].a == NULL)"
      ;
      goto LAB_003cd4b9;
    }
    t1 = *(AActor **)&param->field_0;
    pTVar16 = defaultparam;
    uVar7 = numparam;
    if (t1 != (AActor *)0x0) {
      if ((t1->super_DThinker).super_DObject.Class == (PClass *)0x0) {
        iVar6 = (**(t1->super_DThinker).super_DObject._vptr_DObject)(t1);
        (t1->super_DThinker).super_DObject.Class = (PClass *)CONCAT44(extraout_var,iVar6);
      }
      pPVar10 = (t1->super_DThinker).super_DObject.Class;
      bVar18 = pPVar10 == (PClass *)0x0;
      ret = (VMReturn *)(ulong)!bVar18;
      uVar7 = (uint)bVar18;
      pTVar16 = (TArray<VMValue,_VMValue> *)(ulong)(pPVar10 == pPVar12 || bVar18);
      if (pPVar10 != pPVar12 && !bVar18) {
        do {
          pPVar10 = pPVar10->ParentClass;
          ret = (VMReturn *)(ulong)(pPVar10 != (PClass *)0x0);
          if (pPVar10 == pPVar12) break;
        } while (pPVar10 != (PClass *)0x0);
      }
      if ((char)ret == '\0') {
        pcVar17 = "self == NULL || self->IsKindOf(RUNTIME_CLASS(AActor))";
        goto LAB_003cd4b9;
      }
    }
    pPVar12 = AStateProvider::RegistrationInfo.MyClass;
    if (numparam != 1) {
      if ((param[1].field_0.field_3.Type != '\x03') ||
         ((param[1].field_0.field_1.atag != 1 && (param[1].field_0.field_1.a != (void *)0x0))))
      goto LAB_003cd425;
      puVar4 = (undefined8 *)param[1].field_0.field_1.a;
      if (puVar4 != (undefined8 *)0x0) {
        if (puVar4[1] == 0) {
          uVar9 = (**(code **)*puVar4)(puVar4,pTVar16,uVar7,ret);
          puVar4[1] = uVar9;
        }
        pPVar10 = (PClass *)puVar4[1];
        bVar18 = pPVar10 != (PClass *)0x0;
        if (pPVar10 != pPVar12 && bVar18) {
          do {
            pPVar10 = pPVar10->ParentClass;
            bVar18 = pPVar10 != (PClass *)0x0;
            if (pPVar10 == pPVar12) break;
          } while (pPVar10 != (PClass *)0x0);
        }
        if (!bVar18) {
          pcVar17 = "stateowner == NULL || stateowner->IsKindOf(RUNTIME_CLASS(AStateProvider))";
          goto LAB_003cd4b9;
        }
      }
      if (2 < numparam) {
        if (param[2].field_0.field_3.Type == '\x03') {
          if (numparam == 3) {
            pcVar17 = "(paramnum) < numparam";
          }
          else {
            if (param[3].field_0.field_3.Type == '\0') {
              pvVar5 = param[2].field_0.field_1.a;
              iVar6 = param[3].field_0.i;
              if (numparam < 5) {
                pVVar11 = defaultparam->Array;
                if (pVVar11[4].field_0.field_3.Type != '\0') {
                  pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
                  goto LAB_003cd4d8;
                }
              }
              else {
                pVVar11 = param;
                if (param[4].field_0.field_3.Type != '\0') {
                  pcVar17 = "(param[paramnum]).Type == REGT_INT";
LAB_003cd4d8:
                  __assert_fail(pcVar17,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x818,
                                "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              if (numparam < 6) {
                pVVar14 = defaultparam->Array;
                if (pVVar14[5].field_0.field_3.Type != '\0') {
                  pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
                  goto LAB_003cd4f7;
                }
              }
              else {
                pVVar14 = param;
                if (param[5].field_0.field_3.Type != '\0') {
                  pcVar17 = "(param[paramnum]).Type == REGT_INT";
LAB_003cd4f7:
                  __assert_fail(pcVar17,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x819,
                                "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              local_d4 = pVVar14[5].field_0.i;
              if (numparam < 7) {
                pVVar14 = defaultparam->Array;
                if ((pVVar14[6].field_0.field_3.Type != '\x03') ||
                   ((pVVar13 = pVVar14 + 6, pVVar14[6].field_0.field_1.atag != 1 &&
                    ((pVVar13->field_0).field_1.a != (void *)0x0)))) {
                  pcVar17 = 
                  "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                  ;
                  goto LAB_003cd472;
                }
              }
              else if ((param[6].field_0.field_3.Type != '\x03') ||
                      ((pVVar13 = param + 6, param[6].field_0.field_1.atag != 1 &&
                       ((pVVar13->field_0).field_1.a != (void *)0x0)))) {
                pcVar17 = 
                "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                ;
LAB_003cd472:
                __assert_fail(pcVar17,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x81a,
                              "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              local_a0 = (PClassActor *)(pVVar13->field_0).field_1.a;
              if (numparam < 8) {
                pVVar14 = defaultparam->Array;
                if (pVVar14[7].field_0.field_3.Type != '\x01') {
                  pcVar17 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                  goto LAB_003cd516;
                }
              }
              else {
                pVVar14 = param;
                if (param[7].field_0.field_3.Type != '\x01') {
                  pcVar17 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003cd516:
                  __assert_fail(pcVar17,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x81b,
                                "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              local_c8 = pVVar14[7].field_0.f;
              if (numparam < 9) {
                pVVar14 = defaultparam->Array;
                if (pVVar14[8].field_0.field_3.Type != '\x01') {
                  pcVar17 = "(defaultparam[paramnum]).Type == REGT_FLOAT";
                  goto LAB_003cd535;
                }
              }
              else {
                pVVar14 = param;
                if (param[8].field_0.field_3.Type != '\x01') {
                  pcVar17 = "(param[paramnum]).Type == REGT_FLOAT";
LAB_003cd535:
                  __assert_fail(pcVar17,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x81c,
                                "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              local_d0 = pVVar14[8].field_0.field_1.a;
              if (numparam < 10) {
                pVVar14 = defaultparam->Array;
                if (pVVar14[9].field_0.field_3.Type != '\0') {
                  pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
                  goto LAB_003cd554;
                }
              }
              else {
                pVVar14 = param;
                if (param[9].field_0.field_3.Type != '\0') {
                  pcVar17 = "(param[paramnum]).Type == REGT_INT";
LAB_003cd554:
                  __assert_fail(pcVar17,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x81d,
                                "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              max = pVVar14[9].field_0.i;
              if (numparam < 0xb) {
                pVVar14 = defaultparam->Array;
                if ((pVVar14[10].field_0.field_3.Type != '\x03') ||
                   ((pVVar13 = pVVar14 + 10, pVVar14[10].field_0.field_1.atag != 1 &&
                    ((pVVar13->field_0).field_1.a != (void *)0x0)))) {
                  pcVar17 = 
                  "(defaultparam[paramnum]).Type == REGT_POINTER && ((defaultparam[paramnum]).atag == ATAG_OBJECT || (defaultparam[paramnum]).a == nullptr)"
                  ;
                  goto LAB_003cd491;
                }
              }
              else if ((param[10].field_0.field_3.Type != '\x03') ||
                      ((pVVar13 = param + 10, param[10].field_0.field_1.atag != 1 &&
                       ((pVVar13->field_0).field_1.a != (void *)0x0)))) {
                pcVar17 = 
                "(param[paramnum]).Type == REGT_POINTER && ((param[paramnum]).atag == ATAG_OBJECT || (param[paramnum]).a == nullptr)"
                ;
LAB_003cd491:
                __assert_fail(pcVar17,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x81e,
                              "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              local_b0 = (PClassInventory *)(pVVar13->field_0).field_1.a;
              if (numparam < 0xc) {
                pVVar14 = defaultparam->Array;
                if (pVVar14[0xb].field_0.field_3.Type != '\0') {
                  pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
                  goto LAB_003cd573;
                }
              }
              else {
                pVVar14 = param;
                if (param[0xb].field_0.field_3.Type != '\0') {
                  pcVar17 = "(param[paramnum]).Type == REGT_INT";
LAB_003cd573:
                  __assert_fail(pcVar17,
                                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                ,0x81f,
                                "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                               );
                }
              }
              iVar2 = pVVar14[0xb].field_0.i;
              if (numparam < 0xd) {
                param = defaultparam->Array;
                if (param[0xc].field_0.field_3.Type != '\0') {
                  pcVar17 = "(defaultparam[paramnum]).Type == REGT_INT";
                  goto LAB_003cd592;
                }
              }
              else if (param[0xc].field_0.field_3.Type != '\0') {
                pcVar17 = "(param[paramnum]).Type == REGT_INT";
LAB_003cd592:
                __assert_fail(pcVar17,
                              "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                              ,0x820,
                              "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                             );
              }
              if (t1->player != (player_t *)0x0) {
                uStack_c0 = 0;
                iVar3 = param[0xc].field_0.i;
                this = t1->player->ReadyWeapon;
                if (pVVar11[4].field_0.i == 0) {
                  uVar7 = FRandom::GenRand32(&pr_cwpunch);
                  iVar6 = iVar6 * ((uVar7 & 7) + 1);
                }
                uVar7 = FRandom::GenRand32(&pr_cwpunch);
                uVar8 = FRandom::GenRand32(&pr_cwpunch);
                local_a8 = (AActor *)
                           ((double)(int)((uVar7 & 0xff) - (uVar8 & 0xff)) * 0.02197265625 +
                           (t1->Angles).Yaw.Degrees);
                local_c8 = (double)(~-(ulong)(local_c8 == 0.0) & (ulong)local_c8 |
                                   -(ulong)(local_c8 == 0.0) & 0x4050000000000000);
                local_40 = (DThinker *)0x0;
                local_38 = local_a8;
                P_AimLineAttack((AActor *)local_68,(DAngle *)t1,local_c8,
                                (FTranslatedLineTarget *)&local_38,(DAngle *)&local_88,
                                (int)&local_40,(AActor *)0x0,(AActor *)0x0);
                uVar7 = local_d4;
                uVar19 = (undefined4)local_68._0_8_;
                uVar20 = SUB84(local_68._0_8_,4);
                if (((((local_d4 & 1) != 0) && (local_88.linetarget != (AActor *)0x0)) &&
                    (this != (AWeapon *)0x0)) &&
                   ((pvVar5 != (void *)0x0 && t1->player != (player_t *)0x0 &&
                    (*(int *)((long)pvVar5 + 8) == 1)))) {
                  local_e0 = (_func_int **)local_68._0_8_;
                  bVar18 = AWeapon::DepleteAmmo(this,this->bAltFire,true,-1);
                  uVar19 = SUB84(local_e0,0);
                  uVar20 = (undefined4)((ulong)local_e0 >> 0x20);
                  if (!bVar18) {
                    return 0;
                  }
                }
                pufftype = local_a0;
                if (local_a0 == (PClassActor *)0x0) {
                  local_68._0_4_ = 0x40;
                  local_e0 = (_func_int **)CONCAT44(uVar20,uVar19);
                  pPVar12 = PClass::FindClass((FName *)local_68);
                  pufftype = dyn_cast<PClassActor>((DObject *)pPVar12);
                  uVar19 = SUB84(local_e0,0);
                  uVar20 = (undefined4)((ulong)local_e0 >> 0x20);
                }
                local_48.Degrees = (double)local_a8;
                local_68._24_8_ = CONCAT44(uVar20,uVar19);
                local_8c.Index = 0x89;
                P_LineAttack(t1,&local_48,local_c8,(DAngle *)(local_68 + 0x18),iVar6,&local_8c,
                             pufftype,(uVar7 >> 2 & 2) + 1,&local_88,&local_e4);
                if (local_88.linetarget == (AActor *)0x0) {
                  if (iVar3 != 0) {
                    local_90.ID = iVar3;
                    S_Sound(t1,1,&local_90,1.0,1.0);
                  }
                }
                else {
                  if ((0.0 < (double)local_d0) && ((((local_88.linetarget)->flags5).Value & 1) == 0)
                     ) {
                    if ((uVar7 & 0x20) == 0) {
                      P_GiveBody(t1,(int)((double)local_d0 * (double)local_e4),max);
                    }
                    else {
                      type = local_b0;
                      if (local_b0 == (PClassInventory *)0x0) {
                        pPVar12 = PClass::FindClass("ArmorBonus");
                        type = dyn_cast<PClassInventory>((DObject *)pPVar12);
                      }
                      if (type != (PClassInventory *)0x0) {
                        pPVar15 = type;
                        if (type != (PClassInventory *)ABasicArmorBonus::RegistrationInfo.MyClass) {
                          do {
                            pPVar15 = (PClassInventory *)
                                      (pPVar15->super_PClassActor).super_PClass.ParentClass;
                            if (pPVar15 ==
                                (PClassInventory *)ABasicArmorBonus::RegistrationInfo.MyClass)
                            break;
                          } while (pPVar15 != (PClassInventory *)0x0);
                          if (pPVar15 == (PClassInventory *)0x0) {
                            __assert_fail("armorbonustype->IsDescendantOf(RUNTIME_CLASS(ABasicArmorBonus))"
                                          ,
                                          "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                                          ,0x852,
                                          "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                                         );
                          }
                        }
                        local_68._0_8_ = (_func_int **)0x0;
                        local_68._8_8_ = (PClass *)0x0;
                        local_68._16_8_ = (DObject *)0x0;
                        this_00 = (AInventory *)
                                  AActor::StaticSpawn(&type->super_PClassActor,(DVector3 *)local_68,
                                                      NO_REPLACE,false);
                        *(int *)((long)&this_00[1].super_AActor.super_DThinker.super_DObject.ObjNext
                                + 4) = (int)((double)local_d0 * (double)local_e4) *
                                       *(int *)((long)&this_00[1].super_AActor.super_DThinker.
                                                       super_DObject.ObjNext + 4);
                        if (max < 1) {
                          max = *(int *)&this_00[1].super_AActor.super_DThinker.super_DObject.Class;
                        }
                        *(int *)&this_00[1].super_AActor.super_DThinker.super_DObject.Class = max;
                        pbVar1 = (byte *)((long)&(this_00->super_AActor).flags.Value + 2);
                        *pbVar1 = *pbVar1 | 2;
                        AActor::ClearCounters((AActor *)this_00);
                        bVar18 = AInventory::CallTryPickup(this_00,t1,(AActor **)0x0);
                        if (!bVar18) {
                          (*(this_00->super_AActor).super_DThinker.super_DObject._vptr_DObject[4])
                                    (this_00);
                        }
                      }
                    }
                  }
                  if (this != (AWeapon *)0x0) {
                    if (iVar2 == 0) {
                      local_98.ID = (this->super_AStateProvider).super_AInventory.super_AActor.
                                    AttackSound.super_FSoundID.ID;
                      sound_id = &local_98;
                    }
                    else {
                      sound_id = &local_94;
                      local_94.ID = iVar2;
                    }
                    S_Sound(t1,1,sound_id,1.0,1.0);
                  }
                  if ((uVar7 & 0x10) == 0) {
                    (t1->Angles).Yaw.Degrees = local_88.angleFromSource.Degrees;
                  }
                  if ((uVar7 & 4) != 0) {
                    *(byte *)&(t1->flags).Value = (byte)(t1->flags).Value | 0x80;
                  }
                  if ((uVar7 & 2) != 0) {
                    P_DaggerAlert(t1,local_88.linetarget);
                  }
                }
              }
              return 0;
            }
            pcVar17 = "param[paramnum].Type == REGT_INT";
          }
          __assert_fail(pcVar17,
                        "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                        ,0x817,
                        "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
                       );
        }
        pcVar17 = "param[paramnum].Type == REGT_POINTER";
        goto LAB_003cd4b9;
      }
    }
  }
  pcVar17 = "(paramnum) < numparam";
LAB_003cd4b9:
  __assert_fail(pcVar17,
                "/workspace/llm4binary/github/license_all_cmakelists_25/SeongGino[P]zdoom/src/p_actionfunctions.cpp"
                ,0x816,
                "int AF_AStateProvider_A_CustomPunch(VMValue *, TArray<VMValue> &, int, VMReturn *, int)"
               );
}

Assistant:

DEFINE_ACTION_FUNCTION(AStateProvider, A_CustomPunch)
{
	PARAM_ACTION_PROLOGUE(AStateProvider);
	PARAM_INT		(damage);
	PARAM_BOOL_DEF	(norandom);
	PARAM_INT_DEF	(flags);
	PARAM_CLASS_DEF	(pufftype, AActor);
	PARAM_FLOAT_DEF	(range);
	PARAM_FLOAT_DEF	(lifesteal);
	PARAM_INT_DEF	(lifestealmax);
	PARAM_CLASS_DEF	(armorbonustype, ABasicArmorBonus);
	PARAM_SOUND_DEF	(MeleeSound);
	PARAM_SOUND_DEF	(MissSound);

	if (!self->player)
		return 0;

	player_t *player = self->player;
	AWeapon *weapon = player->ReadyWeapon;


	DAngle angle;
	DAngle pitch;
	FTranslatedLineTarget t;
	int			actualdamage;

	if (!norandom)
		damage *= pr_cwpunch() % 8 + 1;

	angle = self->Angles.Yaw + pr_cwpunch.Random2() * (5.625 / 256);
	if (range == 0) range = DEFMELEERANGE;
	pitch = P_AimLineAttack (self, angle, range, &t);

	// only use ammo when actually hitting something!
	if ((flags & CPF_USEAMMO) && t.linetarget && weapon && ACTION_CALL_FROM_PSPRITE())
	{
		if (!weapon->DepleteAmmo(weapon->bAltFire, true))
			return 0;	// out of ammo
	}

	if (pufftype == NULL)
		pufftype = PClass::FindActor(NAME_BulletPuff);
	int puffFlags = LAF_ISMELEEATTACK | ((flags & CPF_NORANDOMPUFFZ) ? LAF_NORANDOMPUFFZ : 0);

	P_LineAttack (self, angle, range, pitch, damage, NAME_Melee, pufftype, puffFlags, &t, &actualdamage);

	if (!t.linetarget)
	{
		if (MissSound) S_Sound(self, CHAN_WEAPON, MissSound, 1, ATTN_NORM);
	}
	else
	{
		if (lifesteal > 0 && !(t.linetarget->flags5 & MF5_DONTDRAIN))
		{
			if (flags & CPF_STEALARMOR)
			{
				if (armorbonustype == NULL)
				{
					armorbonustype = dyn_cast<ABasicArmorBonus::MetaClass>(PClass::FindClass("ArmorBonus"));
				}
				if (armorbonustype != NULL)
				{
					assert(armorbonustype->IsDescendantOf(RUNTIME_CLASS(ABasicArmorBonus)));
					ABasicArmorBonus *armorbonus = static_cast<ABasicArmorBonus *>(Spawn(armorbonustype));
					armorbonus->SaveAmount *= int(actualdamage * lifesteal);
					armorbonus->MaxSaveAmount = lifestealmax <= 0 ? armorbonus->MaxSaveAmount : lifestealmax;
					armorbonus->flags |= MF_DROPPED;
					armorbonus->ClearCounters();

					if (!armorbonus->CallTryPickup(self))
					{
						armorbonus->Destroy ();
					}
				}
			}
			else
			{
				P_GiveBody (self, int(actualdamage * lifesteal), lifestealmax);
			}
		}
		if (weapon != NULL)
		{
			if (MeleeSound) S_Sound(self, CHAN_WEAPON, MeleeSound, 1, ATTN_NORM);
			else			S_Sound (self, CHAN_WEAPON, weapon->AttackSound, 1, ATTN_NORM);
		}

		if (!(flags & CPF_NOTURN))
		{
			// turn to face target
			self->Angles.Yaw = t.angleFromSource;
		}

		if (flags & CPF_PULLIN) self->flags |= MF_JUSTATTACKED;
		if (flags & CPF_DAGGER) P_DaggerAlert (self, t.linetarget);
	}
	return 0;
}